

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib.c
# Opt level: O0

void sprint_long_canframe(char *buf,canfd_frame *cf,int view,int maxdlen)

{
  int iVar1;
  char cVar2;
  uint uVar3;
  uint in_ECX;
  uint in_EDX;
  uint *in_RSI;
  char *in_RDI;
  uchar dlc;
  can_frame *ccf;
  int len;
  int offset;
  int dlen;
  int j;
  int i;
  uint local_40;
  byte local_39;
  int local_28;
  int local_24;
  int local_20;
  uint local_1c;
  
  local_40 = in_ECX;
  if ((int)(uint)(byte)in_RSI[1] <= (int)in_ECX) {
    local_40 = (uint)(byte)in_RSI[1];
  }
  memset(in_RDI,0x20,0xf);
  if ((*in_RSI & 0x20000000) == 0) {
    if ((*in_RSI & 0x80000000) == 0) {
      if ((in_EDX & 0x10) == 0) {
        _put_id(in_RDI,2,*in_RSI & 0x7ff);
        local_28 = 5;
      }
      else {
        _put_id(in_RDI + 5,2,*in_RSI & 0x7ff);
        local_28 = 10;
      }
    }
    else {
      _put_id(in_RDI,7,*in_RSI & 0x1fffffff);
      local_28 = 10;
    }
  }
  else {
    _put_id(in_RDI,7,*in_RSI & 0x3fffffff);
    local_28 = 10;
  }
  if (in_ECX == 8) {
    if ((in_EDX & 0x20) == 0) {
      in_RDI[local_28 + 1] = '[';
      in_RDI[local_28 + 2] = (byte)local_40 + 0x30;
      in_RDI[local_28 + 3] = ']';
    }
    else {
      local_39 = *(byte *)((long)in_RSI + 7);
      if (((local_40 != 8) || (local_39 < 9)) || (0xf < local_39)) {
        local_39 = (byte)local_40;
      }
      in_RDI[local_28 + 1] = '{';
      in_RDI[local_28 + 2] = "0123456789ABCDEF"[local_39];
      in_RDI[local_28 + 3] = '}';
    }
    if ((*in_RSI & 0x40000000) != 0) {
      sprintf(in_RDI + (long)local_28 + 5," remote request");
      return;
    }
  }
  else {
    in_RDI[local_28] = '[';
    in_RDI[local_28 + 1] = (char)((int)local_40 / 10) + '0';
    in_RDI[local_28 + 2] = (char)((int)local_40 % 10) + '0';
    in_RDI[local_28 + 3] = ']';
  }
  local_28 = local_28 + 5;
  local_1c = local_40;
  if ((in_EDX & 2) == 0) {
    local_24 = 3;
    if ((in_EDX & 4) == 0) {
      for (local_1c = 0; (int)local_1c < (int)local_40; local_1c = local_1c + 1) {
        in_RDI[local_28] = ' ';
        put_hex_byte(in_RDI + (local_28 + 1),*(__u8 *)((long)in_RSI + (long)(int)local_1c + 8));
        local_28 = local_28 + 3;
      }
    }
    else {
      while (iVar1 = local_28, local_1c = local_1c - 1, -1 < (int)local_1c) {
        if (local_1c == local_40 - 1) {
          in_RDI[local_28] = ' ';
        }
        else {
          in_RDI[local_28] = '`';
        }
        local_28 = local_28 + 1;
        put_hex_byte(in_RDI + local_28,*(__u8 *)((long)in_RSI + (long)(int)local_1c + 8));
        local_28 = iVar1 + 3;
      }
    }
  }
  else {
    local_24 = 9;
    if ((in_EDX & 4) == 0) {
      for (local_1c = 0; (int)local_1c < (int)local_40; local_1c = local_1c + 1) {
        in_RDI[local_28] = ' ';
        for (local_20 = 7; local_28 = local_28 + 1, -1 < local_20; local_20 = local_20 + -1) {
          cVar2 = '0';
          if ((1 << ((byte)local_20 & 0x1f) &
              (uint)*(byte *)((long)in_RSI + (long)(int)local_1c + 8)) != 0) {
            cVar2 = '1';
          }
          in_RDI[local_28] = cVar2;
        }
      }
    }
    else {
      while (local_1c = local_1c - 1, -1 < (int)local_1c) {
        cVar2 = '`';
        if (local_1c == local_40 - 1) {
          cVar2 = ' ';
        }
        in_RDI[local_28] = cVar2;
        for (local_20 = 7; local_28 = local_28 + 1, -1 < local_20; local_20 = local_20 + -1) {
          cVar2 = '0';
          if ((1 << ((byte)local_20 & 0x1f) &
              (uint)*(byte *)((long)in_RSI + (long)(int)local_1c + 8)) != 0) {
            cVar2 = '1';
          }
          in_RDI[local_28] = cVar2;
        }
      }
    }
  }
  in_RDI[local_28] = '\0';
  if ((int)local_40 < 9) {
    if ((*in_RSI & 0x20000000) == 0) {
      if ((in_EDX & 1) != 0) {
        uVar3 = local_24 * (8 - local_40) + 4;
        if ((in_EDX & 4) == 0) {
          sprintf(in_RDI + local_28,"%*s",(ulong)uVar3,"\'");
          local_28 = uVar3 + local_28;
          for (local_1c = 0; (int)local_1c < (int)local_40; local_1c = local_1c + 1) {
            if ((*(byte *)((long)in_RSI + (long)(int)local_1c + 8) < 0x20) ||
               (0x7e < *(byte *)((long)in_RSI + (long)(int)local_1c + 8))) {
              in_RDI[local_28] = '.';
            }
            else {
              in_RDI[local_28] = *(char *)((long)in_RSI + (long)(int)local_1c + 8);
            }
            local_28 = local_28 + 1;
          }
          sprintf(in_RDI + local_28,"\'");
        }
        else {
          sprintf(in_RDI + local_28,"%*s",(ulong)uVar3,"`");
          local_28 = uVar3 + local_28;
          while (local_1c = local_40 - 1, -1 < (int)local_1c) {
            if ((*(byte *)((long)in_RSI + (long)(int)local_1c + 8) < 0x20) ||
               (0x7e < *(byte *)((long)in_RSI + (long)(int)local_1c + 8))) {
              in_RDI[local_28] = '.';
            }
            else {
              in_RDI[local_28] = *(char *)((long)in_RSI + (long)(int)local_1c + 8);
            }
            local_28 = local_28 + 1;
            local_40 = local_1c;
          }
          sprintf(in_RDI + local_28,"`");
        }
      }
    }
    else {
      sprintf(in_RDI + local_28,"%*s",(ulong)(local_24 * (8 - local_40) + 0xd),"ERRORFRAME");
    }
  }
  return;
}

Assistant:

void sprint_long_canframe(char *buf , struct canfd_frame *cf, int view, int maxdlen) {
	/* documentation see lib.h */

	int i, j, dlen, offset;
	int len = (cf->len > maxdlen)? maxdlen : cf->len;

	/* initialize space for CAN-ID and length information */
	memset(buf, ' ', 15);

	if (cf->can_id & CAN_ERR_FLAG) {
		put_eff_id(buf, cf->can_id & (CAN_ERR_MASK|CAN_ERR_FLAG));
		offset = 10;
	} else if (cf->can_id & CAN_EFF_FLAG) {
		put_eff_id(buf, cf->can_id & CAN_EFF_MASK);
		offset = 10;
	} else {
		if (view & CANLIB_VIEW_INDENT_SFF) {
			put_sff_id(buf + 5, cf->can_id & CAN_SFF_MASK);
			offset = 10;
		} else {
			put_sff_id(buf, cf->can_id & CAN_SFF_MASK);
			offset = 5;
		}
	}

	/* The len value is sanitized by maxdlen (see above) */
	if (maxdlen == CAN_MAX_DLEN) {
		if (view & CANLIB_VIEW_LEN8_DLC) {
			struct can_frame *ccf = (struct can_frame *)cf;
			unsigned char dlc = ccf->len8_dlc;

			/* fall back to len if we don't have a valid DLC > 8 */
			if (!((len == CAN_MAX_DLEN) && (dlc > CAN_MAX_DLEN) &&
			      (dlc <= CAN_MAX_RAW_DLC)))
				dlc = len;

			buf[offset + 1] = '{';
			buf[offset + 2] = hex_asc_upper[dlc];
			buf[offset + 3] = '}';
		} else {
			buf[offset + 1] = '[';
			buf[offset + 2] = len + '0';
			buf[offset + 3] = ']';
		}

		/* standard CAN frames may have RTR enabled */
		if (cf->can_id & CAN_RTR_FLAG) {
			sprintf(buf+offset+5, " remote request");
			return;
		}
	} else {
		buf[offset] = '[';
		buf[offset + 1] = (len/10) + '0';
		buf[offset + 2] = (len%10) + '0';
		buf[offset + 3] = ']';
	}
	offset += 5;

	if (view & CANLIB_VIEW_BINARY) {
		dlen = 9; /* _10101010 */
		if (view & CANLIB_VIEW_SWAP) {
			for (i = len - 1; i >= 0; i--) {
				buf[offset++] = (i == len-1)?' ':SWAP_DELIMITER;
				for (j = 7; j >= 0; j--)
					buf[offset++] = (1<<j & cf->data[i])?'1':'0';
			}
		} else {
			for (i = 0; i < len; i++) {
				buf[offset++] = ' ';
				for (j = 7; j >= 0; j--)
					buf[offset++] = (1<<j & cf->data[i])?'1':'0';
			}
		}
	} else {
		dlen = 3; /* _AA */
		if (view & CANLIB_VIEW_SWAP) {
			for (i = len - 1; i >= 0; i--) {
				if (i == len-1)
					buf[offset++] = ' ';
				else
					buf[offset++] = SWAP_DELIMITER;

				put_hex_byte(buf + offset, cf->data[i]);
				offset += 2;
			}
		} else {
			for (i = 0; i < len; i++) {
				buf[offset++] = ' ';
				put_hex_byte(buf + offset, cf->data[i]);
				offset += 2;
			}
		}
	}

	buf[offset] = 0; /* terminate string */

	/*
	 * The ASCII & ERRORFRAME output is put at a fixed len behind the data.
	 * For now we support ASCII output only for payload length up to 8 bytes.
	 * Does it make sense to write 64 ASCII byte behind 64 ASCII HEX data on the console?
	 */
	if (len > CAN_MAX_DLEN)
		return;

	if (cf->can_id & CAN_ERR_FLAG)
		sprintf(buf+offset, "%*s", dlen*(8-len)+13, "ERRORFRAME");
	else if (view & CANLIB_VIEW_ASCII) {
		j = dlen*(8-len)+4;
		if (view & CANLIB_VIEW_SWAP) {
			sprintf(buf+offset, "%*s", j, "`");
			offset += j;
			for (i = len - 1; i >= 0; i--)
				if ((cf->data[i] > 0x1F) && (cf->data[i] < 0x7F))
					buf[offset++] = cf->data[i];
				else
					buf[offset++] = '.';

			sprintf(buf+offset, "`");
		} else {
			sprintf(buf+offset, "%*s", j, "'");
			offset += j;
			for (i = 0; i < len; i++)
				if ((cf->data[i] > 0x1F) && (cf->data[i] < 0x7F))
					buf[offset++] = cf->data[i];
				else
					buf[offset++] = '.';

			sprintf(buf+offset, "'");
		}
	}
}